

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTableImpl(UntypedMapBase *this,bool reset)

{
  TypeKind TVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  void *local_90;
  UntypedMapBase *local_88;
  UntypedMapBase *local_80;
  UntypedMapBase *local_70;
  anon_class_16_2_3fe2b05f dispatch_key;
  anon_class_8_1_8991fb9c loop;
  LogMessage local_48;
  Voidify local_31;
  unsigned_long local_30;
  uint local_24;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  UntypedMapBase *pUStack_10;
  bool reset_local;
  UntypedMapBase *this_local;
  
  absl_log_internal_check_op_result._7_1_ = reset;
  pUStack_10 = this;
  local_24 = absl::lts_20250127::log_internal::GetReferenceableValue(this->num_buckets_);
  local_30 = absl::lts_20250127::log_internal::GetReferenceableValue(1);
  local_20 = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,unsigned_long>
                       (&local_24,&local_30,"num_buckets_ != kGlobalEmptyTableSize");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
               ,0x76,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  if (this->arena_ == (Arena *)0x0) {
    dispatch_key.this = (UntypedMapBase *)&dispatch_key.loop;
    local_70 = this;
    dispatch_key.loop = (anon_class_8_1_8991fb9c *)this;
    TVar1 = TypeInfo::value_type_kind(&this->type_info_);
    if (TVar1 < kString) {
      ClearTableImpl(bool)::$_2::operator()((__2 *)&local_70);
    }
    else {
      TVar1 = TypeInfo::value_type_kind(&this->type_info_);
      if (TVar1 == kString) {
        local_80 = this;
        ClearTableImpl(bool)::$_2::operator()
                  ((__2 *)&local_70,(anon_class_8_1_8991fb9c_for_value_handler)this);
      }
      else {
        TVar1 = TypeInfo::value_type_kind(&this->type_info_);
        if (TVar1 != kMessage) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
                      ,0x9f);
        }
        local_88 = this;
        ClearTableImpl(bool)::$_2::operator()
                  ((__2 *)&local_70,(anon_class_8_1_8991fb9c_for_value_handler)this);
      }
    }
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) == 0) {
    DeleteTable(this,this->table_,this->num_buckets_);
  }
  else {
    local_90 = (void *)0x0;
    std::fill<google::protobuf::internal::NodeBase**,decltype(nullptr)>
              (this->table_,this->table_ + this->num_buckets_,&local_90);
    this->num_elements_ = 0;
    this->index_of_first_non_null_ = this->num_buckets_;
  }
  return;
}

Assistant:

void UntypedMapBase::ClearTableImpl(bool reset) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (arena_ == nullptr) {
    const auto loop = [this](auto destroy_node) {
      NodeBase** table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        for (NodeBase* node = table[b]; node != nullptr;) {
          NodeBase* next = node->next;
          absl::PrefetchToLocalCacheNta(next);
          destroy_node(node);
          SizedDelete(node, type_info_.node_size);
          node = next;
        }
      }
    };

    const auto dispatch_key = [&](auto value_handler) {
      if (type_info_.key_type_kind() < TypeKind::kString) {
        loop(value_handler);
      } else if (type_info_.key_type_kind() == TypeKind::kString) {
        loop([=](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          value_handler(node);
        });
      } else {
        Unreachable();
      }
    };

    if (type_info_.value_type_kind() < TypeKind::kString) {
      dispatch_key([](NodeBase*) {});
    } else if (type_info_.value_type_kind() == TypeKind::kString) {
      dispatch_key([&](NodeBase* node) {
        GetValue<std::string>(node)->~basic_string();
      });
    } else if (type_info_.value_type_kind() == TypeKind::kMessage) {
      dispatch_key([&](NodeBase* node) {
        GetValue<MessageLite>(node)->DestroyInstance();
      });
    } else {
      Unreachable();
    }
  }

  if (reset) {
    std::fill(table_, table_ + num_buckets_, nullptr);
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}